

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O0

bool __thiscall gnilk::IPCResultSummary::Unmarshal(IPCResultSummary *this,IPCDecoderBase *decoder)

{
  IPCDecoderBase *pIVar1;
  anon_class_8_1_8991fb9c local_40;
  function<void_(gnilk::IPCObject_*)> local_38;
  IPCDecoderBase *local_18;
  IPCDecoderBase *decoder_local;
  IPCResultSummary *this_local;
  
  local_18 = decoder;
  decoder_local = (IPCDecoderBase *)this;
  (*(decoder->super_IPCReader)._vptr_IPCReader[7])(decoder,&this->testsExecuted);
  (*(local_18->super_IPCReader)._vptr_IPCReader[7])(local_18,&this->testsFailed);
  (*(local_18->super_IPCReader)._vptr_IPCReader[0xe])(local_18,&this->durationSec);
  pIVar1 = local_18;
  local_40.this = this;
  std::function<void(gnilk::IPCObject*)>::
  function<gnilk::IPCResultSummary::Unmarshal(gnilk::IPCDecoderBase&)::__0,void>
            ((function<void(gnilk::IPCObject*)> *)&local_38,&local_40);
  (*(pIVar1->super_IPCReader)._vptr_IPCReader[0x10])(pIVar1,&local_38);
  std::function<void_(gnilk::IPCObject_*)>::~function(&local_38);
  return true;
}

Assistant:

bool IPCResultSummary::Unmarshal(IPCDecoderBase &decoder) {
    decoder.ReadI32(testsExecuted);
    decoder.ReadI32(testsFailed);
    decoder.ReadDouble(durationSec);
    decoder.ReadArray([this](IPCObject *ptrObject) {
       auto tr = dynamic_cast<IPCTestResults *>(ptrObject);
       testResults.push_back(tr);
    });

    return true;
}